

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

int __thiscall
Lib::
DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
::remove(DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,char *__filename)

{
  bool bVar1;
  uint64_t uVar2;
  Entry *pEVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  
  pEVar3 = findEntry((DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)__filename,(TermList *)CONCAT71(in_register_00000011,in_DL));
  if (pEVar3 == (Entry *)0x0) {
    this->_capacity = 0;
    this->_nextExpansionOccupancy = 0;
    this->_entries = (Entry *)0x0;
    this->_timestamp = 0;
    this->_size = 0;
    this->_deleted = 0;
    this->_capacityIndex = 0;
  }
  else {
    *(byte *)&pEVar3->field_0 = *(byte *)&pEVar3->field_0 | 1;
    *(ulong *)(__filename + 4) =
         CONCAT44((int)((ulong)*(undefined8 *)(__filename + 4) >> 0x20) + 1,
                  (int)*(undefined8 *)(__filename + 4) + -1);
    uVar2 = (pEVar3->_key)._content;
    bVar1 = (pEVar3->_val).q;
    pEVar3 = (Entry *)(pEVar3->_val).t._content;
    *(undefined1 *)&this->_timestamp = 1;
    this->_deleted = (int)uVar2;
    this->_capacityIndex = (int)(uVar2 >> 0x20);
    *(bool *)&this->_capacity = bVar1;
    this->_entries = pEVar3;
  }
  return (int)this;
}

Assistant:

Option<std::pair<Key,Val>> remove(Key const& key)
  {
    Entry* e=findEntry(key);
    if(!e) {
      return {};
    }
    e->_info.deleted=1;
    _size--;
    _deleted++;
    return some(std::pair<Key,Val>(move_if_value<Key>(e->_key), move_if_value<Val>(e->_val)));
  }